

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::LogUnused(cmMakefile *this,char *reason,string *name)

{
  string *psVar1;
  bool bVar2;
  cmake *this_00;
  bool bVar3;
  size_type sVar4;
  bool bVar5;
  bool bVar6;
  char *pcVar7;
  size_t sVar8;
  ostream *poVar9;
  string path;
  cmListFileContext lfc;
  cmOutputConverter converter;
  ostringstream msg;
  allocator local_2ba;
  allocator local_2b9;
  string local_2b8;
  string *local_298;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  cmListFileContext local_210;
  cmOutputConverter local_1c8;
  undefined1 local_1a8 [32];
  _Alloc_hider local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  long local_168;
  ios_base local_138 [264];
  
  if (this->WarnUnused != true) {
    return;
  }
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  local_2b8._M_string_length = 0;
  local_2b8.field_2._M_local_buf[0] = '\0';
  local_210.Name._M_dataplus._M_p = (pointer)&local_210.Name.field_2;
  local_210.Name._M_string_length = 0;
  local_210.Name.field_2._M_local_buf[0] = '\0';
  psVar1 = &local_210.FilePath;
  local_210.FilePath._M_dataplus._M_p = (pointer)&local_210.FilePath.field_2;
  local_210.FilePath._M_string_length = 0;
  local_210.FilePath.field_2._M_local_buf[0] = '\0';
  local_210.Line = 0;
  local_298 = name;
  if ((this->CallStack).
      super__Vector_base<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->CallStack).
      super__Vector_base<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pcVar7 = cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
    sVar4 = local_2b8._M_string_length;
    strlen(pcVar7);
    std::__cxx11::string::_M_replace((ulong)&local_2b8,0,(char *)sVar4,(ulong)pcVar7);
    std::__cxx11::string::append((char *)&local_2b8);
    std::__cxx11::string::_M_assign((string *)psVar1);
    local_210.Line = 0;
  }
  else {
    GetExecutionContext((cmListFileContext *)local_1a8,this);
    std::__cxx11::string::operator=((string *)&local_210,(string *)local_1a8);
    std::__cxx11::string::operator=((string *)psVar1,(string *)&local_188);
    local_210.Line = local_168;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_p != &local_178) {
      operator_delete(local_188._M_p,local_178._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    std::__cxx11::string::_M_assign((string *)&local_2b8);
  }
  cmOutputConverter::cmOutputConverter(&local_1c8,this->StateSnapshot);
  cmOutputConverter::Convert((string *)local_1a8,&local_1c8,psVar1,HOME,UNCHANGED);
  std::__cxx11::string::operator=((string *)psVar1,(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  bVar2 = this->CheckSystemVars;
  bVar6 = true;
  if (bVar2 == false) {
    pcVar7 = cmake::GetHomeDirectory(this->LocalGenerator->GlobalGenerator->CMakeInstance);
    std::__cxx11::string::string((string *)&local_230,pcVar7,&local_2b9);
    bVar5 = cmsys::SystemTools::IsSubDirectory(&local_2b8,&local_230);
    if (!bVar5) {
      pcVar7 = cmake::GetHomeOutputDirectory(this->LocalGenerator->GlobalGenerator->CMakeInstance);
      std::__cxx11::string::string((string *)&local_250,pcVar7,&local_2ba);
      bVar6 = cmsys::SystemTools::IsSubDirectory(&local_2b8,&local_250);
      if (bVar6) {
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"/CMakeFiles","");
        bVar6 = cmsys::SystemTools::IsSubDirectory(&local_2b8,&local_290);
        bVar6 = !bVar6;
        bVar3 = true;
        bVar5 = true;
      }
      else {
        bVar3 = true;
        bVar5 = false;
        bVar6 = false;
      }
      goto LAB_00328e61;
    }
  }
  bVar3 = false;
  bVar5 = false;
LAB_00328e61:
  if ((bVar5) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2)) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  psVar1 = local_298;
  if ((bVar3) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2)) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((bVar2 == false) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2)) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if (bVar6) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"unused variable (",0x11);
    if (reason == (char *)0x0) {
      std::ios::clear((int)&stack0xfffffffffffffd28 + (int)*(undefined8 *)(local_1a8._0_8_ + -0x18)
                      + 0x130);
    }
    else {
      sVar8 = strlen(reason);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,reason,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,") \'",3);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\'",1);
    this_00 = this->LocalGenerator->GlobalGenerator->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_270,&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.FilePath._M_dataplus._M_p != &local_210.FilePath.field_2) {
    operator_delete(local_210.FilePath._M_dataplus._M_p,
                    CONCAT71(local_210.FilePath.field_2._M_allocated_capacity._1_7_,
                             local_210.FilePath.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.Name._M_dataplus._M_p != &local_210.Name.field_2) {
    operator_delete(local_210.Name._M_dataplus._M_p,
                    CONCAT71(local_210.Name.field_2._M_allocated_capacity._1_7_,
                             local_210.Name.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,
                    CONCAT71(local_2b8.field_2._M_allocated_capacity._1_7_,
                             local_2b8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmMakefile::LogUnused(const char* reason,
                                const std::string& name) const
{
  if (this->WarnUnused)
    {
    std::string path;
    cmListFileContext lfc;
    if (!this->CallStack.empty())
      {
      lfc = this->GetExecutionContext();
      path = lfc.FilePath;
      }
    else
      {
      path = this->GetCurrentSourceDirectory();
      path += "/CMakeLists.txt";
      lfc.FilePath = path;
      lfc.Line = 0;
      }
    cmOutputConverter converter(this->StateSnapshot);
    lfc.FilePath = converter.Convert(lfc.FilePath, cmOutputConverter::HOME);

    if (this->CheckSystemVars ||
        cmSystemTools::IsSubDirectory(path,
                                      this->GetHomeDirectory()) ||
        (cmSystemTools::IsSubDirectory(path,
                                      this->GetHomeOutputDirectory()) &&
        !cmSystemTools::IsSubDirectory(path,
                                cmake::GetCMakeFilesDirectory())))
      {
      std::ostringstream msg;
      msg << "unused variable (" << reason << ") \'" << name << "\'";
      this->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING,
                                             msg.str(),
                                             lfc);
      }
    }
}